

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osqp++_test.cc
# Opt level: O2

void __thiscall
osqp::anon_unknown_0::OsqpTest_DetectsPrimalInfeasible_Test::~OsqpTest_DetectsPrimalInfeasible_Test
          (OsqpTest_DetectsPrimalInfeasible_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(OsqpTest, DetectsPrimalInfeasible) {
  // Minimize 0 subject to:
  // x == 2, x >= 3.
  SparseMatrix<double> objective_matrix(1, 1);

  SparseMatrix<double> constraint_matrix(2, 1);
  const Triplet<double> kTripletsQ[] = {{0, 0, 1.0}, {1, 0, 1.0}};
  constraint_matrix.setFromTriplets(std::begin(kTripletsQ),
                                    std::end(kTripletsQ));

  OsqpInstance instance;
  instance.objective_matrix = objective_matrix;
  instance.objective_vector.resize(1);
  instance.objective_vector << 0.0;
  instance.constraint_matrix = constraint_matrix;
  instance.lower_bounds.resize(2);
  instance.lower_bounds << 2, 3;
  instance.upper_bounds.resize(2);
  instance.upper_bounds << 2, kInfinity;

  OsqpSolver solver;
  OsqpSettings settings;
  ASSERT_TRUE(solver.Init(instance, settings).ok());
  ASSERT_EQ(solver.Solve(), OsqpExitCode::kPrimalInfeasible);
  Eigen::Map<const VectorXd> cert = solver.primal_infeasibility_certificate();
  // The infeasibility certificate satisfies cert[0] + cert[1] == 0,
  // cert[0]* 2 + cert[1] * 3 < 0, and cert[1] <= 0. See the OSQP documentation
  // for the general definition of the certificate.
  EXPECT_THAT(cert[0] / cert[1], DoubleNear(-1.0, kTolerance));
  EXPECT_LE(cert[1], 0.0);
  EXPECT_LT(cert[0] * 2 + cert[1] * 3, 0.0);
}